

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

bool __thiscall
slang::parsing::Preprocessor::expectTimeScaleSpecifier
          (Preprocessor *this,Token *token,TimeScaleValue *value)

{
  Token *pTVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined1 uVar5;
  undefined1 uVar7;
  Info *pIVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  BumpAllocator *alloc;
  double dVar11;
  undefined1 uVar12;
  uint32_t uVar13;
  NumericTokenFlags NVar14;
  optional<slang::TimeUnit> timeUnit;
  optional<slang::TimeScaleValue> oVar16;
  bool bVar15;
  SourceLocation location;
  DiagCode code;
  Diagnostics *this_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  Token TVar17;
  SourceRange range;
  string_view sVar18;
  string_view sVar19;
  string_view sVar20;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar21;
  Token suffix;
  size_t lengthConsumed;
  void *local_88;
  uint local_80;
  byte local_7b;
  Token local_78;
  __extent_storage<18446744073709551615UL> local_68;
  _Storage<slang::TimeScaleValue,_true> *local_60;
  size_t local_58;
  Token local_50;
  char *local_40;
  char *pcStack_38;
  
  pTVar1 = &this->currentToken;
  pIVar4 = (this->currentToken).info;
  local_60 = (_Storage<slang::TimeScaleValue,_true> *)value;
  if (pIVar4 == (Info *)0x0) {
    TVar17 = nextProcessed(this);
    this->currentToken = TVar17;
  }
  else {
    uVar2 = pTVar1->kind;
    uVar5 = pTVar1->field_0x2;
    uVar7 = pTVar1->numFlags;
    uVar9 = pTVar1->rawLen;
    TVar17.rawLen = uVar9;
    TVar17.numFlags.raw = uVar7;
    TVar17._2_1_ = uVar5;
    TVar17.kind = uVar2;
    TVar17.info = pIVar4;
  }
  if (TVar17.kind == IntegerLiteral) {
    if (TVar17.info == (Info *)0x0) {
      TVar17 = nextProcessed(this);
      this->currentToken = TVar17;
    }
    uVar12 = pTVar1->field_0x2;
    NVar14.raw = (pTVar1->numFlags).raw;
    uVar13 = pTVar1->rawLen;
    pIVar4 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar12;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar14.raw;
    (this->lastConsumed).rawLen = uVar13;
    (this->lastConsumed).info = pIVar4;
    Token::Token(&local_50);
    pTVar1->kind = local_50.kind;
    pTVar1->field_0x2 = local_50._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_50.numFlags.raw;
    pTVar1->rawLen = local_50.rawLen;
    (this->currentToken).info = local_50.info;
    *token = TVar17;
    pIVar4 = (this->currentToken).info;
    if (pIVar4 == (Info *)0x0) {
      local_78 = nextProcessed(this);
      this->currentToken = local_78;
    }
    else {
      uVar3 = pTVar1->kind;
      uVar6 = pTVar1->field_0x2;
      uVar8 = pTVar1->numFlags;
      uVar10 = pTVar1->rawLen;
      local_78.rawLen = uVar10;
      local_78.numFlags.raw = uVar8;
      local_78._2_1_ = uVar6;
      local_78.kind = uVar3;
      local_78.info = pIVar4;
    }
    if ((local_78.kind == Identifier) && (bVar15 = Token::isOnSameLine(&local_78), bVar15)) {
      sVar18 = Token::rawText(&local_78);
      sVar19._M_str = (char *)&local_58;
      sVar19._M_len = (size_t)sVar18._M_str;
      timeUnit = suffixToTimeUnit((slang *)sVar18._M_len,sVar19,&local_58);
      if ((((ushort)timeUnit.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::TimeUnit> >> 8 & 1) != 0) &&
         (sVar19 = Token::rawText(&local_78), local_58 == sVar19._M_len)) {
        if ((this->currentToken).info == (Info *)0x0) {
          TVar17 = nextProcessed(this);
          this->currentToken = TVar17;
        }
        uVar12 = pTVar1->field_0x2;
        NVar14.raw = (pTVar1->numFlags).raw;
        uVar13 = pTVar1->rawLen;
        pIVar4 = (this->currentToken).info;
        (this->lastConsumed).kind = pTVar1->kind;
        (this->lastConsumed).field_0x2 = uVar12;
        (this->lastConsumed).numFlags = (NumericTokenFlags)NVar14.raw;
        (this->lastConsumed).rawLen = uVar13;
        (this->lastConsumed).info = pIVar4;
        Token::Token(&local_50);
        pTVar1->kind = local_50.kind;
        pTVar1->field_0x2 = local_50._2_1_;
        pTVar1->numFlags = (NumericTokenFlags)local_50.numFlags.raw;
        pTVar1->rawLen = local_50.rawLen;
        (this->currentToken).info = local_50.info;
        sVar19 = Token::rawText(token);
        sVar18 = Token::rawText(&local_78);
        sVar20 = Token::rawText(&local_78);
        alloc = this->alloc;
        sVar21 = Token::trivia(token);
        local_68 = sVar21._M_extent._M_extent_value;
        local_40 = sVar18._M_str + (sVar20._M_len - (long)sVar19._M_str);
        pcStack_38 = sVar19._M_str;
        location = Token::location(token);
        Token::intValue((Token *)&local_88);
        dVar11 = SVInt::toDouble((SVInt *)&local_88);
        sVar18._M_str = pcStack_38;
        sVar18._M_len = (size_t)local_40;
        trivia._M_extent._M_extent_value = local_68._M_extent_value;
        trivia._M_ptr = sVar21._M_ptr;
        Token::Token(&local_50,alloc,TimeLiteral,trivia,sVar18,location,dVar11,false,timeUnit);
        token->kind = local_50.kind;
        token->field_0x2 = local_50._2_1_;
        token->numFlags = (NumericTokenFlags)local_50.numFlags.raw;
        token->rawLen = local_50.rawLen;
        token->info = local_50.info;
        if (((0x40 < local_80) || ((local_7b & 1) != 0)) && (local_88 != (void *)0x0)) {
          operator_delete__(local_88);
        }
        goto LAB_00209293;
      }
    }
    range = Token::range(token);
    this_00 = this->diagnostics;
    code.subsystem = Preprocessor;
    code.code = 10;
  }
  else {
    TVar17 = expect(this,TimeLiteral);
    *token = TVar17;
    if ((TVar17._0_4_ >> 0x10 & 1) != 0) {
      return false;
    }
LAB_00209293:
    dVar11 = Token::realValue(token);
    NVar14 = Token::numericFlags(token);
    oVar16 = TimeScaleValue::fromLiteral(dVar11,NVar14.raw >> 3 & (Picoseconds|Nanoseconds));
    if (((uint3)oVar16.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScaleValue> >> 0x10 & 1) != 0) {
      *local_60 = oVar16.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::TimeScaleValue>._M_payload;
      return true;
    }
    range = Token::range(token);
    this_00 = this->diagnostics;
    code.subsystem = Preprocessor;
    code.code = 0xf;
  }
  Diagnostics::add(this_00,code,range);
  return false;
}

Assistant:

bool Preprocessor::expectTimeScaleSpecifier(Token& token, TimeScaleValue& value) {
    if (peek(TokenKind::IntegerLiteral)) {
        // We wanted to see a time literal here, but for directives we will allow there
        // to be a space between the integer and suffix portions of the time.
        token = consume();

        auto suffix = peek();
        if (suffix.kind != TokenKind::Identifier || !suffix.isOnSameLine()) {
            addDiag(diag::ExpectedTimeLiteral, token.range());
            return false;
        }

        size_t lengthConsumed;
        auto unit = suffixToTimeUnit(suffix.rawText(), lengthConsumed);
        if (!unit || lengthConsumed != suffix.rawText().length()) {
            addDiag(diag::ExpectedTimeLiteral, token.range());
            return false;
        }

        // Glue the tokens together to form a "time literal"
        consume();
        auto start = token.rawText().data();
        auto end = suffix.rawText().data() + suffix.rawText().size();
        auto text = std::string_view(start, size_t(end - start));

        token = Token(alloc, TokenKind::TimeLiteral, token.trivia(), text, token.location(),
                      token.intValue().toDouble(), false, unit);
    }
    else {
        token = expect(TokenKind::TimeLiteral);
        if (token.isMissing())
            return false;
    }

    auto checked = TimeScaleValue::fromLiteral(token.realValue(), token.numericFlags().unit());
    if (!checked) {
        addDiag(diag::InvalidTimeScaleSpecifier, token.range());
        return false;
    }

    value = *checked;
    return true;
}